

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedNumberFormat::RuleBasedNumberFormat
          (RuleBasedNumberFormat *this,UnicodeString *description,LocalizationInfo *info,
          Locale *alocale,UParseError *perror,UErrorCode *status)

{
  NumberFormat::NumberFormat(&this->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedNumberFormat_003c8020;
  this->defaultRuleSet = (NFRuleSet *)0x0;
  this->fRuleSets = (NFRuleSet **)0x0;
  this->ruleSetDescriptions = (UnicodeString *)0x0;
  this->numRuleSets = 0;
  Locale::Locale(&this->locale,alocale);
  this->defaultInfinityRule = (NFRule *)0x0;
  this->defaultNaNRule = (NFRule *)0x0;
  this->collator = (RuleBasedCollator *)0x0;
  this->decimalFormatSymbols = (DecimalFormatSymbols *)0x0;
  this->fRoundingMode = kRoundUnnecessary;
  this->lenient = '\0';
  this->lenientParseRules = (UnicodeString *)0x0;
  this->localizations = (LocalizationInfo *)0x0;
  (this->originalDescription).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003d8fe8;
  (this->originalDescription).fUnion.fStackFields.fLengthAndFlags = 2;
  this->capitalizationInfoSet = '\0';
  this->capitalizationForUIListMenu = '\0';
  this->capitalizationForStandAlone = '\0';
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  init(this,(EVP_PKEY_CTX *)description);
  return;
}

Assistant:

RuleBasedNumberFormat::RuleBasedNumberFormat(const UnicodeString& description, 
                                             LocalizationInfo* info,
                                             const Locale& alocale, UParseError& perror, UErrorCode& status)
  : fRuleSets(NULL)
  , ruleSetDescriptions(NULL)
  , numRuleSets(0)
  , defaultRuleSet(NULL)
  , locale(alocale)
  , collator(NULL)
  , decimalFormatSymbols(NULL)
  , defaultInfinityRule(NULL)
  , defaultNaNRule(NULL)
  , fRoundingMode(DecimalFormat::ERoundingMode::kRoundUnnecessary)
  , lenient(FALSE)
  , lenientParseRules(NULL)
  , localizations(NULL)
  , capitalizationInfoSet(FALSE)
  , capitalizationForUIListMenu(FALSE)
  , capitalizationForStandAlone(FALSE)
  , capitalizationBrkIter(NULL)
{
  init(description, info, perror, status);
}